

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

TryEmplaceResult * __thiscall
QHash<QGraphicsItem*,std::pair<QFlags<QEventPoint::State>,QList<QEventPoint>>>::
tryEmplace_impl<QGraphicsItem*const&>
          (TryEmplaceResult *__return_storage_ptr__,void *this,QGraphicsItem **key)

{
  uchar uVar1;
  Span *pSVar2;
  Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
  *pDVar3;
  Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_> *pNVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  Bucket BVar8;
  QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_> local_40;
  long local_38;
  Span *pSVar4;
  ulong uVar7;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = *this;
  if (pDVar3 == (Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
                 *)0x0) {
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
             ::detached((Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
                         *)0x0);
    *(Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
      **)this = pDVar3;
  }
  local_40.d = (Data *)0x0;
  uVar6 = ((ulong)*key >> 0x20 ^ (ulong)*key) * -0x2917014799a6026d;
  uVar6 = (uVar6 >> 0x20 ^ uVar6) * -0x2917014799a6026d;
  uVar6 = uVar6 >> 0x20 ^ pDVar3->seed ^ uVar6;
  BVar8 = QHashPrivate::
          Data<QHashPrivate::Node<QGraphicsItem*,std::pair<QFlags<QEventPoint::State>,QList<QEventPoint>>>>
          ::findBucketWithHash<QGraphicsItem*>
                    ((Data<QHashPrivate::Node<QGraphicsItem*,std::pair<QFlags<QEventPoint::State>,QList<QEventPoint>>>>
                      *)pDVar3,key,uVar6);
  uVar7 = BVar8.index;
  pSVar4 = BVar8.span;
  uVar1 = pSVar4->offsets[uVar7];
  pDVar3 = *this;
  if ((pDVar3 == (Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
                  *)0x0) || (1 < (uint)(pDVar3->ref).atomic._q_value.super___atomic_base<int>._M_i))
  {
    QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>::operator=
              (&local_40,
               (QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>
                *)this);
    if (uVar1 == 0xff) {
LAB_0061b71f:
      pDVar3 = *this;
      if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
        pDVar3 = QHashPrivate::
                 Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
                 ::detached(pDVar3,pDVar3->size + 1);
        *(Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
          **)this = pDVar3;
        BVar8 = QHashPrivate::
                Data<QHashPrivate::Node<QGraphicsItem*,std::pair<QFlags<QEventPoint::State>,QList<QEventPoint>>>>
                ::findBucketWithHash<QGraphicsItem*>
                          ((Data<QHashPrivate::Node<QGraphicsItem*,std::pair<QFlags<QEventPoint::State>,QList<QEventPoint>>>>
                            *)pDVar3,key,uVar6);
        goto LAB_0061b79c;
      }
    }
    else {
      pDVar3 = *this;
    }
    pSVar2 = pDVar3->spans;
    pDVar3 = QHashPrivate::
             Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
             ::detached(pDVar3);
    *(Data<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
      **)this = pDVar3;
    BVar8.index._0_4_ = (uint)BVar8.index & 0x7f;
    BVar8.span = pDVar3->spans +
                 ((((ulong)((long)pSVar4 - (long)pSVar2) >> 4) * 0x1c71c71c71c71c80 | uVar7) >> 7);
    BVar8.index._4_4_ = 0;
    if (uVar1 != 0xff) goto LAB_0061b7ce;
  }
  else {
    if (uVar1 != 0xff) goto LAB_0061b7ce;
    if (pDVar3->numBuckets >> 1 <= pDVar3->size) {
      QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>::operator=
                (&local_40,
                 (QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>
                  *)this);
      goto LAB_0061b71f;
    }
  }
LAB_0061b79c:
  pNVar5 = QHashPrivate::
           Span<QHashPrivate::Node<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>_>
           ::insert(BVar8.span,BVar8.index);
  pNVar5->key = *key;
  (pNVar5->value).first.super_QFlagsStorageHelper<QEventPoint::State,_4>.
  super_QFlagsStorage<QEventPoint::State>.i = 0;
  (pNVar5->value).second.d.d = (Data *)0x0;
  (pNVar5->value).second.d.ptr = (QEventPoint *)0x0;
  (pNVar5->value).second.d.size = 0;
  pDVar3 = *this;
  pDVar3->size = pDVar3->size + 1;
LAB_0061b7ce:
  pSVar4 = pDVar3->spans;
  (__return_storage_ptr__->iterator).i.d = pDVar3;
  (__return_storage_ptr__->iterator).i.bucket =
       ((ulong)((long)BVar8.span - (long)pSVar4) >> 4) * 0x1c71c71c71c71c80 | BVar8.index;
  __return_storage_ptr__->inserted = uVar1 == 0xff;
  QHash<QGraphicsItem_*,_std::pair<QFlags<QEventPoint::State>,_QList<QEventPoint>_>_>::~QHash
            (&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

TryEmplaceResult tryEmplace_impl(K &&key, Args &&...args)
    {
        if (!d)
            detach();
        QHash detachGuard;

        size_t hash = QHashPrivate::calculateHash(key, d->seed);
        typename Data::Bucket bucket = d->findBucketWithHash(key, hash);
        const bool shouldInsert = bucket.isUnused();

        // Even if we don't insert we may have to detach because we are
        // returning a non-const iterator:
        if (!isDetached() || (shouldInsert && d->shouldGrow())) {
            detachGuard = *this;
            const bool resized = shouldInsert && d->shouldGrow();
            const size_t bucketIndex = bucket.toBucketIndex(d);

            // Must detach from detachGuard
            d = resized ? Data::detached(d, d->size + 1) : Data::detached(d);
            bucket = resized ? d->findBucketWithHash(key, hash) : typename Data::Bucket(d, bucketIndex);
        }
        if (shouldInsert) {
            Node *n = bucket.insert();
            using ConstructProxy = typename QHashPrivate::HeterogenousConstructProxy<Key, K>;
            Node::createInPlace(n, ConstructProxy(std::forward<K>(key)),
                                std::forward<Args>(args)...);
            ++d->size;
        }
        return {iterator(bucket.toIterator(d)), shouldInsert};
    }